

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_hole.c
# Opt level: O0

zip_source_t * source_hole_create(char *fname,int flags,zip_error_t *error)

{
  hole_t *phVar1;
  hole_t *ud;
  zip_error_t *error_local;
  int flags_local;
  char *fname_local;
  
  phVar1 = hole_new(fname,flags,error);
  if (phVar1 == (hole_t *)0x0) {
    fname_local = (char *)0x0;
  }
  else {
    fname_local = (char *)zip_source_function_create(source_hole_cb,phVar1,error);
  }
  return (zip_source_t *)fname_local;
}

Assistant:

zip_source_t *
source_hole_create(const char *fname, int flags, zip_error_t *error) {
    hole_t *ud = hole_new(fname, flags, error);

    if (ud == NULL) {
	return NULL;
    }
    return zip_source_function_create(source_hole_cb, ud, error);
}